

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
* __thiscall
ninx::lexer::Lexer::generate
          (vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
           *__return_storage_ptr__,Lexer *this)

{
  Reader *this_00;
  pointer puVar1;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  *pvVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Keyword *pKVar7;
  _func_int **pp_Var8;
  ostream *poVar9;
  unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_> *token;
  bool lateSelectorFound;
  int trailing_spaces;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  tokens;
  bool local_81;
  undefined1 local_80 [36];
  int local_5c;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  *local_58;
  Lexer *local_50;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->reader;
  local_58 = __return_storage_ptr__;
  local_50 = this;
  do {
    iVar5 = Reader::get_next_limiter(this_00);
    if (iVar5 == -1) break;
    if (iVar5 < 1) {
      iVar6 = Reader::get_line_number(this_00);
      Reader::read_until_limiter_abi_cxx11_((string *)local_80,this_00);
      pKVar7 = (Keyword *)operator_new(0x38);
      lexer::token::Text::Text((Text *)pKVar7,iVar6,(string *)local_80);
      if ((Keyword *)local_80._0_8_ != (Keyword *)(local_80 + 0x10)) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
      bVar4 = lexer::token::Text::is_empty((Text *)pKVar7);
      if (!bVar4) {
        local_80._0_8_ = pKVar7;
        std::
        vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
        ::
        emplace_back<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>
                  ((vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
                    *)&local_48,
                   (unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                    *)local_80);
        if ((Keyword *)local_80._0_8_ != (Keyword *)0x0) {
          (**(code **)(*(long *)local_80._0_8_ + 8))();
        }
        pKVar7 = (Keyword *)0x0;
      }
      if (pKVar7 != (Keyword *)0x0) {
        pp_Var8 = (pKVar7->super_Token)._vptr_Token;
        goto LAB_00132242;
      }
    }
    else {
      if (iVar5 == 0x24) {
        iVar6 = Reader::get_line_number(this_00);
        Reader::read_identifier_abi_cxx11_((string *)local_80,this_00,&local_5c);
        pKVar7 = (Keyword *)operator_new(0x38);
        lexer::token::Variable::Variable((Variable *)pKVar7,iVar6,(string *)local_80);
        if ((Keyword *)local_80._0_8_ != (Keyword *)(local_80 + 0x10)) {
          operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
        }
        lexer::token::Variable::set_trailing_spaces((Variable *)pKVar7,local_5c);
        local_80._0_8_ = pKVar7;
        std::
        vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
        ::
        emplace_back<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>
                  ((vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
                    *)&local_48,
                   (unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                    *)local_80);
      }
      else if (iVar5 == 0x40) {
        local_81 = false;
        iVar6 = Reader::get_line_number(this_00);
        Reader::read_identifier_abi_cxx11_((string *)local_80,this_00,&local_5c,0x3f,&local_81);
        pKVar7 = (Keyword *)operator_new(0x38);
        lexer::token::Keyword::Keyword(pKVar7,iVar6,(string *)local_80);
        if ((Keyword *)local_80._0_8_ != (Keyword *)(local_80 + 0x10)) {
          operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
        }
        if (local_81 == true) {
          lexer::token::Keyword::set_late(pKVar7,true);
        }
        local_80._0_8_ = pKVar7;
        std::
        vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
        ::
        emplace_back<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>
                  ((vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
                    *)&local_48,
                   (unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                    *)local_80);
      }
      else {
        iVar6 = Reader::get_line_number(this_00);
        pKVar7 = (Keyword *)operator_new(0x10);
        lexer::token::Limiter::Limiter((Limiter *)pKVar7,iVar6,(char)iVar5);
        local_80._0_8_ = pKVar7;
        std::
        vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
        ::
        emplace_back<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>
                  ((vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
                    *)&local_48,
                   (unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                    *)local_80);
      }
      if ((Keyword *)local_80._0_8_ != (Keyword *)0x0) {
        pp_Var8 = *(_func_int ***)local_80._0_8_;
        pKVar7 = (Keyword *)local_80._0_8_;
LAB_00132242:
        (*pp_Var8[1])(pKVar7);
      }
    }
  } while (iVar5 != -1);
  puVar3 = local_48.
           super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = local_48.
           super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_50->verbose == true) {
    for (; puVar1 != puVar3; puVar1 = puVar1 + 1) {
      poVar9 = lexer::token::operator<<
                         ((ostream *)std::cout,
                          (puVar1->_M_t).
                          super___uniq_ptr_impl<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
                          .super__Head_base<0UL,_ninx::lexer::token::Token_*,_false>._M_head_impl);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
  }
  pvVar2 = local_58;
  (local_58->
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (local_58->
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_58->
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ::~vector(&local_48);
  return pvVar2;
}

Assistant:

std::vector<std::unique_ptr<Token>> ninx::lexer::Lexer::generate() {
    std::vector<std::unique_ptr<Token>> tokens;

    while(true) {
        int next_limiter = reader.get_next_limiter();
        if (next_limiter == -1) {  // EOF
            break;
        }

        if (next_limiter > 0) {  // A limiter was found
            switch (next_limiter) {
                case '@':  // Keyword beginning
                {
                    bool lateSelectorFound = false;
                    int trailing_spaces;
                    auto keywordToken = std::make_unique<Keyword>(reader.get_line_number(), reader.read_identifier(trailing_spaces, '?', lateSelectorFound));

                    if (lateSelectorFound) {
                        keywordToken->set_late(true);
                    }

                    tokens.push_back(std::move(keywordToken));
                    break;
                }
                case '$':  // Variable beginning
                {
                    int trailing_spaces;
                    auto variableToken = std::make_unique<Variable>(reader.get_line_number(),
                                                                    reader.read_identifier(trailing_spaces));
                    variableToken->set_trailing_spaces(trailing_spaces);
                    tokens.push_back(std::move(variableToken));
                    break;
                }
                default:   // Other limiters, mark them as generic limiters
                {
                    auto limiterToken = std::make_unique<Limiter>(reader.get_line_number(), static_cast<char>(next_limiter));
                    tokens.push_back(std::move(limiterToken));
                }
            }
        }else{  // A limiter was not found, it is a simple text
            auto token = std::make_unique<Text>(reader.get_line_number(), reader.read_until_limiter());
            // Only add non-empty tokens
            if (!token->is_empty()) {
                tokens.push_back(std::move(token));
            }
        }
    }

    if (verbose) {
        for (auto &token : tokens) {
            std::cout << *token << std::endl;
        }
    }

    return std::move(tokens);
}